

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

void __thiscall aiMetadata::~aiMetadata(aiMetadata *this)

{
  aiMetadataType aVar1;
  void *pvVar2;
  void *data;
  uint i;
  aiMetadata *this_local;
  
  if (this->mKeys != (aiString *)0x0) {
    operator_delete__(this->mKeys);
  }
  this->mKeys = (aiString *)0x0;
  if (this->mValues != (aiMetadataEntry *)0x0) {
    for (data._4_4_ = 0; data._4_4_ < this->mNumProperties; data._4_4_ = data._4_4_ + 1) {
      pvVar2 = this->mValues[data._4_4_].mData;
      aVar1 = this->mValues[data._4_4_].mType;
      if (aVar1 == AI_BOOL) {
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      else if (aVar1 == AI_INT32) {
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      else if (aVar1 == AI_UINT64) {
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      else if (aVar1 == AI_FLOAT) {
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      else if (aVar1 == AI_DOUBLE) {
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      else if (aVar1 == AI_AISTRING) {
        if (pvVar2 != (void *)0x0) {
          operator_delete(pvVar2);
        }
      }
      else if ((aVar1 == AI_AIVECTOR3D) && (pvVar2 != (void *)0x0)) {
        operator_delete(pvVar2);
      }
    }
    if (this->mValues != (aiMetadataEntry *)0x0) {
      operator_delete__(this->mValues);
    }
    this->mValues = (aiMetadataEntry *)0x0;
  }
  return;
}

Assistant:

~aiMetadata() {
        delete [] mKeys;
        mKeys = nullptr;
        if (mValues) {
            // Delete each metadata entry
            for (unsigned i=0; i<mNumProperties; ++i) {
                void* data = mValues[i].mData;
                switch (mValues[i].mType) {
                case AI_BOOL:
                    delete static_cast< bool* >( data );
                    break;
                case AI_INT32:
                    delete static_cast< int32_t* >( data );
                    break;
                case AI_UINT64:
                    delete static_cast< uint64_t* >( data );
                    break;
                case AI_FLOAT:
                    delete static_cast< float* >( data );
                    break;
                case AI_DOUBLE:
                    delete static_cast< double* >( data );
                    break;
                case AI_AISTRING:
                    delete static_cast< aiString* >( data );
                    break;
                case AI_AIVECTOR3D:
                    delete static_cast< aiVector3D* >( data );
                    break;
#ifndef SWIG
                case FORCE_32BIT:
#endif
                default:
                    break;
                }
            }

            // Delete the metadata array
            delete [] mValues;
            mValues = nullptr;
        }
    }